

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P11Objects.cpp
# Opt level: O3

int __thiscall P11DESSecretKeyObj::init(P11DESSecretKeyObj *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  int iVar2;
  unsigned_long uVar3;
  P11Attribute *this_00;
  mapped_type *ppPVar4;
  int iVar5;
  undefined8 unaff_RBX;
  unsigned_long value;
  EVP_PKEY_CTX *ctx_00;
  OSAttribute setKeyType;
  OSAttribute local_c0;
  
  iVar5 = (int)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  if ((this->super_P11SecretKeyObj).super_P11KeyObj.super_P11Object.field_0x43 != '\0') {
    return iVar5;
  }
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    return 0;
  }
  cVar1 = (**(code **)(*(long *)ctx + 0x10))(ctx,0x100);
  if (cVar1 == '\0') {
    value = this->keytype;
  }
  else {
    uVar3 = (**(code **)(*(long *)ctx + 0x28))(ctx,0x100,0x80000000);
    value = this->keytype;
    if (uVar3 == value) goto LAB_00129af5;
  }
  OSAttribute::OSAttribute(&local_c0,value);
  (**(code **)(*(long *)ctx + 0x40))(ctx,0x100,&local_c0);
  OSAttribute::~OSAttribute(&local_c0);
LAB_00129af5:
  iVar2 = P11SecretKeyObj::init(&this->super_P11SecretKeyObj,ctx);
  if ((char)iVar2 == '\0') {
    return 0;
  }
  this_00 = (P11Attribute *)operator_new(0x28);
  ctx_00 = (EVP_PKEY_CTX *)(this->super_P11SecretKeyObj).super_P11KeyObj.super_P11Object.osobject;
  P11Attribute::P11Attribute(this_00,(OSObject *)ctx_00);
  this_00->_vptr_P11Attribute = (_func_int **)&PTR__P11Attribute_00199928;
  this_00->type = 0x11;
  this_00->checks = 0x69;
  iVar2 = P11Attribute::init(this_00,ctx_00);
  if ((char)iVar2 == '\0') {
    softHSMLog(3,"init",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/P11Objects.cpp"
               ,0x68d,"Could not initialize the attribute");
    (*this_00->_vptr_P11Attribute[1])(this_00);
    return 0;
  }
  local_c0._vptr_OSAttribute = (_func_int **)P11Attribute::getType(this_00);
  ppPVar4 = std::
            map<unsigned_long,_P11Attribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_P11Attribute_*>_>_>
            ::operator[](&(this->super_P11SecretKeyObj).super_P11KeyObj.super_P11Object.attributes,
                         (key_type *)&local_c0);
  *ppPVar4 = this_00;
  (this->super_P11SecretKeyObj).super_P11KeyObj.super_P11Object.field_0x43 = 1;
  return iVar5;
}

Assistant:

bool P11DESSecretKeyObj::init(OSObject *inobject)
{
	if (initialized) return true;
	if (inobject == NULL) return false;

	if (!inobject->attributeExists(CKA_KEY_TYPE) || inobject->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != keytype) {
		OSAttribute setKeyType(keytype);
		inobject->setAttribute(CKA_KEY_TYPE, setKeyType);
	}

	// Create parent
	if (!P11SecretKeyObj::init(inobject)) return false;

	// Create attributes
	P11Attribute* attrValue = new P11AttrValue(osobject,P11Attribute::ck1|P11Attribute::ck4|P11Attribute::ck6|P11Attribute::ck7);

	// Initialize the attributes
	if (!attrValue->init())
	{
		ERROR_MSG("Could not initialize the attribute");
		delete attrValue;
		return false;
	}

	// Add them to the map
	attributes[attrValue->getType()] = attrValue;

	initialized = true;
	return true;
}